

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numberformatter.h
# Opt level: O2

void __thiscall icu_63::number::impl::MacroProps::MacroProps(MacroProps *this)

{
  (this->notation).fType = NTN_SIMPLE;
  (this->notation).fUnion = (NotationUnion)0x0;
  MeasureUnit::MeasureUnit(&this->unit);
  MeasureUnit::MeasureUnit(&this->perUnit);
  (this->precision).fType = RND_BOGUS;
  this->roundingMode = UNUM_FOUND_HALFEVEN;
  (this->grouper).fGrouping1 = -3;
  (this->padder).fWidth = -2;
  (this->integerWidth).fHasError = false;
  (this->integerWidth).fUnion.minMaxInt.fMinInt = -1;
  (this->symbols).fType = SYMPTR_NONE;
  (this->symbols).fPtr.dfs = (DecimalFormatSymbols *)0x0;
  this->unitWidth = UNUM_UNIT_WIDTH_COUNT;
  this->sign = UNUM_SIGN_COUNT;
  this->decimal = UNUM_DECIMAL_SEPARATOR_COUNT;
  (this->scale).fMagnitude = 0;
  (this->scale).fArbitrary = (DecNum *)0x0;
  (this->scale).fError = U_ZERO_ERROR;
  this->currencySymbols = (CurrencySymbols *)0x0;
  this->affixProvider = (AffixPatternProvider *)0x0;
  this->rules = (PluralRules *)0x0;
  this->threshold = 3;
  Locale::Locale(&this->locale);
  return;
}

Assistant:

struct U_I18N_API MacroProps : public UMemory {
    /** @internal */
    Notation notation;

    /** @internal */
    MeasureUnit unit; // = NoUnit::base();

    /** @internal */
    MeasureUnit perUnit; // = NoUnit::base();

    /** @internal */
    Precision precision;  // = Precision();  (bogus)

    /** @internal */
    UNumberFormatRoundingMode roundingMode = UNUM_ROUND_HALFEVEN;

    /** @internal */
    Grouper grouper;  // = Grouper();  (bogus)

    /** @internal */
    Padder padder;    // = Padder();   (bogus)

    /** @internal */
    IntegerWidth integerWidth; // = IntegerWidth(); (bogus)

    /** @internal */
    SymbolsWrapper symbols;

    // UNUM_XYZ_COUNT denotes null (bogus) values.

    /** @internal */
    UNumberUnitWidth unitWidth = UNUM_UNIT_WIDTH_COUNT;

    /** @internal */
    UNumberSignDisplay sign = UNUM_SIGN_COUNT;

    /** @internal */
    UNumberDecimalSeparatorDisplay decimal = UNUM_DECIMAL_SEPARATOR_COUNT;

    /** @internal */
    Scale scale;  // = Scale();  (benign value)

    /** @internal */
    const AffixPatternProvider* affixProvider = nullptr;  // no ownership

    /** @internal */
    const PluralRules* rules = nullptr;  // no ownership

    /** @internal */
    const CurrencySymbols* currencySymbols = nullptr;  // no ownership

    /** @internal */
    int32_t threshold = DEFAULT_THRESHOLD;

    /** @internal */
    Locale locale;

    // NOTE: Uses default copy and move constructors.

    /**
     * Check all members for errors.
     * @internal
     */
    bool copyErrorTo(UErrorCode &status) const {
        return notation.copyErrorTo(status) || precision.copyErrorTo(status) ||
               padder.copyErrorTo(status) || integerWidth.copyErrorTo(status) ||
               symbols.copyErrorTo(status) || scale.copyErrorTo(status);
    }
}